

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  long lVar1;
  pointer piVar2;
  ulong uVar3;
  
  lVar1 = google::protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                    ((_func_void_ptr_Arena_ptr *)(this->annotation_proto_ + 0x10));
  piVar2 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    uVar3 = 0;
    do {
      RepeatedField<int>::Add((RepeatedField<int> *)(lVar1 + 0x18),piVar2[uVar3]);
      uVar3 = uVar3 + 1;
      piVar2 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
    } while (uVar3 < (ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  *(byte *)(lVar1 + 0x10) = *(byte *)(lVar1 + 0x10) | 1;
  google::protobuf::internal::ArenaStringPtr::Set<>((string *)(lVar1 + 0x30),(Arena *)file_path);
  *(int *)(lVar1 + 0x38) = (int)begin_offset;
  *(int *)(lVar1 + 0x3c) = (int)end_offset;
  *(byte *)(lVar1 + 0x10) = *(byte *)(lVar1 + 0x10) | 6;
  if (((ulong)semantic.
              super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
              _M_payload.
              super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> >>
       0x20 & 1) == 0) {
    return;
  }
  SetSemantic<google::protobuf::GeneratedCodeInfo_Annotation>
            (lVar1,(ulong)semantic.
                          super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                   & 0xffffffff);
  return;
}

Assistant:

void AddAnnotation(size_t begin_offset, size_t end_offset,
                     const std::string& file_path, const std::vector<int>& path,
                     absl::optional<Semantic> semantic) override {
    auto* annotation = annotation_proto_->add_annotation();
    for (int i = 0; i < path.size(); ++i) {
      annotation->add_path(path[i]);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);

    if (semantic.has_value()) {
      SetSemantic(annotation, *semantic, Rank1{});
    }
  }